

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void test_base<unsigned_long,unsigned_int,bool(*)(unsigned_long,unsigned_int,unsigned_long*),unsigned_long(*)(unsigned_long,unsigned_int),0>
               (char *type_str,_func_bool_unsigned_long_uint_unsigned_long_ptr *fcn1,
               _func_unsigned_long_unsigned_long_uint *fcn2)

{
  bool bVar1;
  runtime_error *prVar2;
  char *pcVar3;
  runtime_error *prVar4;
  TestCase<unsigned_long,_unsigned_int,_0> TVar5;
  string msg_1;
  safe_test<unsigned_long,_unsigned_int> st;
  bool actual;
  string msg;
  bool result;
  check_test<unsigned_long,_unsigned_int> ct;
  unsigned_long ret;
  TestCase<unsigned_long,_unsigned_int,_0> test;
  TestVector<unsigned_long,_unsigned_int,_0> tests;
  uint in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  TestVector<unsigned_long,_unsigned_int,_0> *in_stack_fffffffffffffe28;
  check_test<unsigned_long,_unsigned_int> *in_stack_fffffffffffffe30;
  allocator *paVar6;
  unsigned_long local_1a0;
  uint local_198;
  bool bStack_194;
  allocator local_179;
  string local_178 [32];
  string local_158 [32];
  string local_138 [67];
  undefined1 local_f5;
  allocator local_e1;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [70];
  undefined1 local_5a;
  unsigned_long local_58;
  TestCase<unsigned_long,_unsigned_int,_0> local_50;
  unsigned_long local_40;
  uint local_38;
  byte local_34;
  TestVector<unsigned_long,_unsigned_int,_0> local_30 [2];
  
  TestVector<unsigned_long,_unsigned_int,_0>::TestVector(local_30);
  local_50 = TestVector<unsigned_long,_unsigned_int,_0>::GetNext(in_stack_fffffffffffffe28);
  local_40 = local_50.x;
  local_38 = local_50.y;
  local_34 = local_50.fExpected;
  while( true ) {
    bVar1 = TestVector<unsigned_long,_unsigned_int,_0>::Done(local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_5a = check_test<unsigned_long,unsigned_int>::operator()
                         (in_stack_fffffffffffffe30,
                          (_func_bool_unsigned_long_uint_unsigned_long_ptr *)
                          in_stack_fffffffffffffe28,(unsigned_long)in_stack_fffffffffffffe20,
                          in_stack_fffffffffffffe1c,(unsigned_long *)0x18895b);
    if (local_5a != (local_34 & 1)) break;
    local_58 = safe_test<unsigned_long,unsigned_int>::operator()
                         ((safe_test<unsigned_long,_unsigned_int> *)in_stack_fffffffffffffe30,
                          (_func_unsigned_long_unsigned_long_uint *)in_stack_fffffffffffffe28,
                          (unsigned_long)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    local_f5 = 1;
    if ((local_34 & 1) != 1) {
      paVar6 = &local_179;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"Failure in ",paVar6);
      OpName::op_name(0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      prVar2 = prVar4;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::runtime_error::runtime_error(prVar2,pcVar3);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TVar5 = TestVector<unsigned_long,_unsigned_int,_0>::GetNext(in_stack_fffffffffffffe28);
    local_1a0 = TVar5.x;
    local_198 = TVar5.y;
    bStack_194 = TVar5.fExpected;
    local_40 = local_1a0;
    local_38 = local_198;
    local_34 = bStack_194;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"Failure in ",&local_e1);
  OpName::op_name(0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::runtime_error::runtime_error(prVar2,pcVar3);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}